

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

bool __thiscall wasm::Type::isStruct(Type *this)

{
  HeapTypeKind HVar1;
  HeapType local_10;
  
  if ((this->id & 1) == 0 && 6 < this->id) {
    local_10 = getHeapType(this);
    HVar1 = HeapType::getKind(&local_10);
    return HVar1 == Struct;
  }
  return false;
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }